

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall
SubcommandProgram_MixedOrderExtras_Test::TestBody(SubcommandProgram_MixedOrderExtras_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_dc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ca8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_9c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_988;
  AssertHelper local_8f0;
  Message local_8e8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8e0;
  undefined1 local_8df;
  allocator local_8de;
  allocator local_8dd;
  allocator local_8dc;
  allocator local_8db;
  allocator local_8da;
  allocator local_8d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  string local_8b0 [32];
  string local_890 [32];
  string local_870 [32];
  string local_850 [32];
  string local_830 [32];
  iterator local_810;
  size_type local_808;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_800;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7e8;
  undefined1 local_7d0 [8];
  AssertionResult gtest_ar_7;
  Message local_7b8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7ac;
  undefined1 local_7ab;
  allocator local_7aa;
  allocator local_7a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  string local_780 [32];
  iterator local_760;
  size_type local_758;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_750;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_738;
  undefined1 local_720 [8];
  AssertionResult gtest_ar_6;
  Message local_708;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6fc;
  undefined1 local_6fb;
  allocator local_6fa;
  allocator local_6f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  string local_6d0 [32];
  iterator local_6b0;
  size_type local_6a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_688;
  undefined1 local_670 [8];
  AssertionResult gtest_ar_5;
  Message local_658;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_64c;
  undefined1 local_64b;
  allocator local_64a;
  allocator local_649;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  string local_620 [32];
  iterator local_600;
  size_type local_5f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5d8;
  undefined1 local_5c0 [8];
  AssertionResult gtest_ar_4;
  allocator local_5a8;
  allocator local_5a7;
  allocator local_5a6;
  allocator local_5a5;
  allocator local_5a4;
  allocator local_5a3;
  allocator local_5a2;
  allocator local_5a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  string local_578 [32];
  string local_558 [32];
  string local_538 [32];
  string local_518 [32];
  string local_4f8 [32];
  string local_4d8 [32];
  string local_4b8 [32];
  iterator local_498;
  size_type local_490;
  AssertHelper local_488;
  Message local_480;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_478;
  undefined1 local_477;
  allocator local_476;
  allocator local_475;
  allocator local_474;
  allocator local_473;
  allocator local_472;
  allocator local_471;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  string local_448 [32];
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  iterator local_3a8;
  size_type local_3a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_398;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_380;
  undefined1 local_368 [8];
  AssertionResult gtest_ar_3;
  Message local_350;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_344;
  undefined1 local_343;
  allocator local_342;
  allocator local_341;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  string local_318 [32];
  iterator local_2f8;
  size_type local_2f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d0;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_2;
  Message local_2a0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_294;
  undefined1 local_293;
  allocator local_292;
  allocator local_291;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268 [32];
  iterator local_248;
  size_type local_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_220;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_1;
  Message local_1f0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e4;
  undefined1 local_1e3;
  allocator local_1e2;
  allocator local_1e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8 [32];
  iterator local_198;
  size_type local_190;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  undefined1 local_158 [8];
  AssertionResult gtest_ar;
  allocator local_140;
  allocator local_13f;
  allocator local_13e;
  allocator local_13d [20];
  allocator local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  iterator local_20;
  size_type local_18;
  undefined1 local_10 [8];
  SubcommandProgram_MixedOrderExtras_Test *this_local;
  
  local_10 = (undefined1  [8])this;
  CLI::App::allow_extras(&(this->super_SubcommandProgram).super_TApp.app,true);
  CLI::App::allow_extras((this->super_SubcommandProgram).start,true);
  CLI::App::allow_extras((this->super_SubcommandProgram).stop,true);
  gtest_ar.message_.ptr_._4_1_ = 1;
  local_128 = &local_120;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"one",&local_129);
  local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"two",local_13d);
  local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"start",&local_13e);
  local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"three",&local_13f);
  local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"four",&local_140);
  local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"stop",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"five",(allocator *)((long)&gtest_ar.message_.ptr_ + 6));
  local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"six",(allocator *)((long)&gtest_ar.message_.ptr_ + 5));
  gtest_ar.message_.ptr_._4_1_ = 0;
  local_20 = &local_120;
  local_18 = 8;
  __l_08._M_len = 8;
  __l_08._M_array = local_20;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_SubcommandProgram).super_TApp.args,__l_08);
  local_988 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20;
  do {
    local_988 = local_988 + -1;
    std::__cxx11::string::~string((string *)local_988);
  } while (local_988 != &local_120);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  std::allocator<char>::~allocator((allocator<char> *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_13f);
  std::allocator<char>::~allocator((allocator<char> *)&local_13e);
  std::allocator<char>::~allocator((allocator<char> *)local_13d);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  TApp::run((TApp *)this);
  CLI::App::remaining_abi_cxx11_(&local_170,&(this->super_SubcommandProgram).super_TApp.app,false);
  local_1e3 = 1;
  local_1e0 = &local_1d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d8,"one",&local_1e1);
  local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"two",&local_1e2);
  local_1e3 = 0;
  local_198 = &local_1d8;
  local_190 = 2;
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_1e4);
  __l_07._M_len = local_190;
  __l_07._M_array = local_198;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_188,__l_07,&local_1e4);
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((EqHelper<false> *)local_158,"app.remaining()",
             "std::vector<std::string>({\"one\", \"two\"})",&local_170,&local_188);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_188);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_1e4);
  local_9c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_198;
  do {
    local_9c8 = local_9c8 + -1;
    std::__cxx11::string::~string((string *)local_9c8);
  } while (local_9c8 != &local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e2);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_170);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x26a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  CLI::App::remaining_abi_cxx11_(&local_220,(this->super_SubcommandProgram).start,false);
  local_293 = 1;
  local_290 = &local_288;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_288,"three",&local_291);
  local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_268,"four",&local_292);
  local_293 = 0;
  local_248 = &local_288;
  local_240 = 2;
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_294);
  __l_06._M_len = local_240;
  __l_06._M_array = local_248;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_238,__l_06,&local_294);
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((EqHelper<false> *)local_208,"start->remaining()",
             "std::vector<std::string>({\"three\", \"four\"})",&local_220,&local_238);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_238);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_294);
  local_a68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_248;
  do {
    local_a68 = local_a68 + -1;
    std::__cxx11::string::~string((string *)local_a68);
  } while (local_a68 != &local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_292);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_220);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(&local_2a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x26b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_2a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  CLI::App::remaining_abi_cxx11_(&local_2d0,(this->super_SubcommandProgram).stop,false);
  local_343 = 1;
  local_340 = &local_338;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_338,"five",&local_341);
  local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_318,"six",&local_342);
  local_343 = 0;
  local_2f8 = &local_338;
  local_2f0 = 2;
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_344);
  __l_05._M_len = local_2f0;
  __l_05._M_array = local_2f8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2e8,__l_05,&local_344);
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((EqHelper<false> *)local_2b8,"stop->remaining()",
             "std::vector<std::string>({\"five\", \"six\"})",&local_2d0,&local_2e8);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2e8);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_344);
  local_ae0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f8;
  do {
    local_ae0 = local_ae0 + -1;
    std::__cxx11::string::~string((string *)local_ae0);
  } while (local_ae0 != &local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_342);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar1) {
    testing::Message::Message(&local_350);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x26c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  CLI::App::remaining_abi_cxx11_(&local_380,&(this->super_SubcommandProgram).super_TApp.app,true);
  local_477 = 1;
  local_470 = &local_468;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_468,"one",&local_471);
  local_470 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_448,"two",&local_472);
  local_470 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_428;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"three",&local_473);
  local_470 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_408,"four",&local_474);
  local_470 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e8,"five",&local_475);
  local_470 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c8,"six",&local_476);
  local_477 = 0;
  local_3a8 = &local_468;
  local_3a0 = 6;
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_478);
  __l_04._M_len = local_3a0;
  __l_04._M_array = local_3a8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_398,__l_04,&local_478);
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((EqHelper<false> *)local_368,"app.remaining(true)",
             "std::vector<std::string>({\"one\", \"two\", \"three\", \"four\", \"five\", \"six\"})",
             &local_380,&local_398);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_398);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_478);
  local_b98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3a8;
  do {
    local_b98 = local_b98 + -1;
    std::__cxx11::string::~string((string *)local_b98);
  } while (local_b98 != &local_468);
  std::allocator<char>::~allocator((allocator<char> *)&local_476);
  std::allocator<char>::~allocator((allocator<char> *)&local_475);
  std::allocator<char>::~allocator((allocator<char> *)&local_474);
  std::allocator<char>::~allocator((allocator<char> *)&local_473);
  std::allocator<char>::~allocator((allocator<char> *)&local_472);
  std::allocator<char>::~allocator((allocator<char> *)&local_471);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_380);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
  if (!bVar1) {
    testing::Message::Message(&local_480);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_368);
    testing::internal::AssertHelper::AssertHelper
              (&local_488,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x26d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_488,&local_480);
    testing::internal::AssertHelper::~AssertHelper(&local_488);
    testing::Message::~Message(&local_480);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
  CLI::App::reset(&(this->super_SubcommandProgram).super_TApp.app);
  gtest_ar_4.message_.ptr_._7_1_ = 1;
  local_5a0 = &local_598;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_598,"one",&local_5a1);
  local_5a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_578;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_578,"two",&local_5a2);
  local_5a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_558,"stop",&local_5a3);
  local_5a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_538;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_538,"three",&local_5a4);
  local_5a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_518;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"four",&local_5a5);
  local_5a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f8,"start",&local_5a6);
  local_5a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4d8,"five",&local_5a7);
  local_5a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4b8,"six",&local_5a8);
  gtest_ar_4.message_.ptr_._7_1_ = 0;
  local_498 = &local_598;
  local_490 = 8;
  __l_03._M_len = 8;
  __l_03._M_array = local_498;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_SubcommandProgram).super_TApp.args,__l_03);
  local_c68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_498;
  do {
    local_c68 = local_c68 + -1;
    std::__cxx11::string::~string((string *)local_c68);
  } while (local_c68 != &local_598);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a7);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a6);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a5);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a4);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a3);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a2);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
  TApp::run((TApp *)this);
  CLI::App::remaining_abi_cxx11_(&local_5d8,&(this->super_SubcommandProgram).super_TApp.app,false);
  local_64b = 1;
  local_648 = &local_640;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_640,"one",&local_649);
  local_648 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_620,"two",&local_64a);
  local_64b = 0;
  local_600 = &local_640;
  local_5f8 = 2;
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_64c);
  __l_02._M_len = local_5f8;
  __l_02._M_array = local_600;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_5f0,__l_02,&local_64c);
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((EqHelper<false> *)local_5c0,"app.remaining()",
             "std::vector<std::string>({\"one\", \"two\"})",&local_5d8,&local_5f0);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5f0);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_64c);
  local_ca8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_600;
  do {
    local_ca8 = local_ca8 + -1;
    std::__cxx11::string::~string((string *)local_ca8);
  } while (local_ca8 != &local_640);
  std::allocator<char>::~allocator((allocator<char> *)&local_64a);
  std::allocator<char>::~allocator((allocator<char> *)&local_649);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c0);
  if (!bVar1) {
    testing::Message::Message(&local_658);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x273,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_658);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_658);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c0);
  CLI::App::remaining_abi_cxx11_(&local_688,(this->super_SubcommandProgram).stop,false);
  local_6fb = 1;
  local_6f8 = &local_6f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6f0,"three",&local_6f9);
  local_6f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6d0,"four",&local_6fa);
  local_6fb = 0;
  local_6b0 = &local_6f0;
  local_6a8 = 2;
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_6fc);
  __l_01._M_len = local_6a8;
  __l_01._M_array = local_6b0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_6a0,__l_01,&local_6fc);
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((EqHelper<false> *)local_670,"stop->remaining()",
             "std::vector<std::string>({\"three\", \"four\"})",&local_688,&local_6a0);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_6a0);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_6fc);
  local_d48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6b0;
  do {
    local_d48 = local_d48 + -1;
    std::__cxx11::string::~string((string *)local_d48);
  } while (local_d48 != &local_6f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6fa);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_688);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_670);
  if (!bVar1) {
    testing::Message::Message(&local_708);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_670);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x274,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_708);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_708);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
  CLI::App::remaining_abi_cxx11_(&local_738,(this->super_SubcommandProgram).start,false);
  local_7ab = 1;
  local_7a8 = &local_7a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7a0,"five",&local_7a9);
  local_7a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_780;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_780,"six",&local_7aa);
  local_7ab = 0;
  local_760 = &local_7a0;
  local_758 = 2;
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_7ac);
  __l_00._M_len = local_758;
  __l_00._M_array = local_760;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_750,__l_00,&local_7ac);
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((EqHelper<false> *)local_720,"start->remaining()",
             "std::vector<std::string>({\"five\", \"six\"})",&local_738,&local_750);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_750);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_7ac);
  local_dc0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_760;
  do {
    local_dc0 = local_dc0 + -1;
    std::__cxx11::string::~string((string *)local_dc0);
  } while (local_dc0 != &local_7a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7aa);
  std::allocator<char>::~allocator((allocator<char> *)&local_7a9);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_738);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_720);
  if (!bVar1) {
    testing::Message::Message(&local_7b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_720);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x275,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_7b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_7b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_720);
  CLI::App::remaining_abi_cxx11_(&local_7e8,&(this->super_SubcommandProgram).super_TApp.app,true);
  local_8df = 1;
  local_8d8 = &local_8d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8d0,"one",&local_8d9);
  local_8d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8b0,"two",&local_8da);
  local_8d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_890;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_890,"three",&local_8db);
  local_8d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_870;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_870,"four",&local_8dc);
  local_8d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_850;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_850,"five",&local_8dd);
  local_8d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_830;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_830,"six",&local_8de);
  local_8df = 0;
  local_810 = &local_8d0;
  local_808 = 6;
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_8e0);
  __l._M_len = local_808;
  __l._M_array = local_810;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_800,__l,&local_8e0);
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((EqHelper<false> *)local_7d0,"app.remaining(true)",
             "std::vector<std::string>({\"one\", \"two\", \"three\", \"four\", \"five\", \"six\"})",
             &local_7e8,&local_800);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_800);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_8e0);
  local_e78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_810;
  do {
    local_e78 = local_e78 + -1;
    std::__cxx11::string::~string((string *)local_e78);
  } while (local_e78 != &local_8d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8de);
  std::allocator<char>::~allocator((allocator<char> *)&local_8dd);
  std::allocator<char>::~allocator((allocator<char> *)&local_8dc);
  std::allocator<char>::~allocator((allocator<char> *)&local_8db);
  std::allocator<char>::~allocator((allocator<char> *)&local_8da);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_7e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7d0);
  if (!bVar1) {
    testing::Message::Message(&local_8e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_8f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x276,pcVar2);
    testing::internal::AssertHelper::operator=(&local_8f0,&local_8e8);
    testing::internal::AssertHelper::~AssertHelper(&local_8f0);
    testing::Message::~Message(&local_8e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d0);
  return;
}

Assistant:

TEST_F(SubcommandProgram, MixedOrderExtras) {

    app.allow_extras();
    start->allow_extras();
    stop->allow_extras();

    args = {"one", "two", "start", "three", "four", "stop", "five", "six"};
    run();

    EXPECT_EQ(app.remaining(), std::vector<std::string>({"one", "two"}));
    EXPECT_EQ(start->remaining(), std::vector<std::string>({"three", "four"}));
    EXPECT_EQ(stop->remaining(), std::vector<std::string>({"five", "six"}));
    EXPECT_EQ(app.remaining(true), std::vector<std::string>({"one", "two", "three", "four", "five", "six"}));

    app.reset();
    args = {"one", "two", "stop", "three", "four", "start", "five", "six"};
    run();

    EXPECT_EQ(app.remaining(), std::vector<std::string>({"one", "two"}));
    EXPECT_EQ(stop->remaining(), std::vector<std::string>({"three", "four"}));
    EXPECT_EQ(start->remaining(), std::vector<std::string>({"five", "six"}));
    EXPECT_EQ(app.remaining(true), std::vector<std::string>({"one", "two", "three", "four", "five", "six"}));
}